

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O1

void Mio_WritePin(FILE *pFile,Mio_Pin_t *pPin,int NameLen,int fAllPins)

{
  undefined4 in_register_00000014;
  
  if (fAllPins == 0) {
    fprintf((FILE *)pFile,"\n    PIN %*s  ",CONCAT44(in_register_00000014,NameLen),pPin->pName);
  }
  else {
    fwrite("PIN *  ",7,1,(FILE *)pFile);
  }
  fprintf((FILE *)pFile,"%7s ",*(undefined8 *)(&DAT_00bcbe70 + (ulong)pPin->Phase * 8));
  fprintf((FILE *)pFile,"%3d ",(ulong)(uint)(int)pPin->dLoadInput);
  fprintf((FILE *)pFile,"%3d ",(ulong)(uint)(int)pPin->dLoadMax);
  fprintf((FILE *)pFile,"%8.2f ",pPin->dDelayBlockRise);
  fprintf((FILE *)pFile,"%8.2f ",pPin->dDelayFanoutRise);
  fprintf((FILE *)pFile,"%8.2f ",pPin->dDelayBlockFall);
  fprintf((FILE *)pFile,"%8.2f",pPin->dDelayFanoutFall);
  return;
}

Assistant:

void Mio_WritePin( FILE * pFile, Mio_Pin_t * pPin, int NameLen, int fAllPins )
{
    char * pPhaseNames[10] = { "UNKNOWN", "INV", "NONINV" };
    if ( fAllPins )
        fprintf( pFile, "PIN *  " );
    else
        fprintf( pFile, "\n    PIN %*s  ", NameLen, pPin->pName );
    fprintf( pFile, "%7s ",   pPhaseNames[pPin->Phase] );
    fprintf( pFile, "%3d ",   (int)pPin->dLoadInput );
    fprintf( pFile, "%3d ",   (int)pPin->dLoadMax );
    fprintf( pFile, "%8.2f ", pPin->dDelayBlockRise );
    fprintf( pFile, "%8.2f ", pPin->dDelayFanoutRise );
    fprintf( pFile, "%8.2f ", pPin->dDelayBlockFall );
    fprintf( pFile, "%8.2f",  pPin->dDelayFanoutFall );
}